

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayTests.cpp
# Opt level: O2

void __thiscall Array3dTest_Access_Test::Array3dTest_Access_Test(Array3dTest_Access_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001fa5f0;
  return;
}

Assistant:

TEST(Array3dTest, Access)
{
    Array3d<int> a(6, 4, 1, -1);
    for (int i = 0; i < 6; i++)
    for (int j = 0; j < 4; j++)
    for (int k = 0; k < 1; k++)
        a(i, j, k) = i + j + k;
    for (int i = 0; i < 6; i++)
    for (int j = 0; j < 4; j++)
    for (int k = 0; k < 1; k++)
        ASSERT_EQ(i + j + k, a(i, j, k));
}